

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_comparison_expression.cpp
# Opt level: O1

bool duckdb::BoundComparisonExpression::TryBindComparison
               (ClientContext *context,LogicalType *left_type,LogicalType *right_type,
               LogicalType *result_type,ExpressionType comparison_type)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  reference this;
  BinderException *this_00;
  LogicalType *extraout_RDX;
  LogicalType *type;
  LogicalType *extraout_RDX_00;
  LogicalType *type_00;
  byte bVar4;
  long lVar5;
  byte bVar6;
  undefined3 in_register_00000081;
  size_type __n;
  LogicalTypeId LVar7;
  bool bVar8;
  initializer_list<duckdb::LogicalType> __l;
  uint8_t width;
  vector<duckdb::LogicalType,_true> argument_types;
  uint8_t scale;
  uint8_t in_stack_ffffffffffffff1d;
  uint8_t in_stack_ffffffffffffff1e;
  LogicalType local_e0;
  undefined1 local_c8 [48];
  LogicalType *local_98;
  undefined1 local_88 [32];
  shared_ptr<duckdb::ExtraTypeInfo,_true> *local_68;
  string local_50;
  
  LogicalType::LogicalType(&local_e0);
  if ((CONCAT31(in_register_00000081,comparison_type) < 0x29) &&
     ((0x13806000000U >> ((ulong)CONCAT31(in_register_00000081,comparison_type) & 0x3f) & 1) != 0))
  {
    LogicalType::ForceMaxLogicalType((LogicalType *)local_c8,left_type,right_type);
    local_e0.physical_type_ = local_c8[1];
    local_e0.id_ = local_c8[0];
    local_c8._8_8_ =
         local_e0.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    LogicalType::~LogicalType((LogicalType *)local_c8);
    type = extraout_RDX;
  }
  else {
    bVar8 = LogicalType::TryGetMaxLogicalType(context,left_type,right_type,&local_e0);
    type = extraout_RDX_00;
    if (!bVar8) {
      bVar8 = false;
      goto LAB_011b8827;
    }
  }
  if (local_e0.id_ == VARCHAR) {
    if (((ulong)left_type->id_ < 0x33) &&
       ((0x60045f8fffc00U >> ((ulong)left_type->id_ & 0x3f) & 1) != 0)) {
      LogicalType::NormalizeType((LogicalType *)local_c8,left_type);
    }
    else {
      if ((0x32 < (ulong)right_type->id_) ||
         ((0x60045f8fffc00U >> ((ulong)right_type->id_ & 0x3f) & 1) == 0)) {
        StringType::GetCollation_abi_cxx11_((string *)local_c8,(StringType *)left_type,type);
        StringType::GetCollation_abi_cxx11_((string *)local_88,(StringType *)right_type,type_00);
        if ((((element_type *)local_c8._8_8_ != (element_type *)0x0) &&
            ((element_type *)local_88._8_8_ != (element_type *)0x0)) &&
           ((local_c8._8_8_ != local_88._8_8_ ||
            (iVar3 = bcmp((void *)CONCAT62(local_c8._2_6_,CONCAT11(local_c8[1],local_c8[0])),
                          (void *)local_88._0_8_,local_c8._8_8_), iVar3 != 0)))) {
          this_00 = (BinderException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Cannot combine types with different collation!","");
          BinderException::BinderException(this_00,&local_50);
          __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((element_type *)local_88._0_8_ != (element_type *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_);
        }
        puVar1 = (undefined1 *)CONCAT62(local_c8._2_6_,CONCAT11(local_c8[1],local_c8[0]));
        if (puVar1 != local_c8 + 0x10) {
          operator_delete(puVar1);
        }
        goto LAB_011b87fe;
      }
      LogicalType::NormalizeType((LogicalType *)local_c8,right_type);
    }
    local_e0.physical_type_ = local_c8[1];
    local_e0.id_ = local_c8[0];
    LogicalType::~LogicalType((LogicalType *)local_c8);
  }
  else if (local_e0.id_ == DECIMAL) {
    LogicalType::LogicalType((LogicalType *)local_c8,left_type);
    LogicalType::LogicalType((LogicalType *)(local_c8 + 0x18),right_type);
    __l._M_len = 2;
    __l._M_array = (iterator)local_c8;
    local_98 = result_type;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_88,__l,
               (allocator_type *)&local_50);
    lVar5 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(local_c8 + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
    bVar8 = local_88._8_8_ != local_88._0_8_;
    if (bVar8) {
      local_68 = &local_98->type_info_;
      __n = 0;
      bVar4 = 0;
      bVar6 = 0;
      LVar7 = INVALID;
      do {
        this = vector<duckdb::LogicalType,_true>::operator[]
                         ((vector<duckdb::LogicalType,_true> *)local_88,__n);
        bVar2 = LogicalType::GetDecimalProperties(this,local_c8,(uint8_t *)&local_50);
        if (bVar2) {
          if (LVar7 < local_c8[0]) {
            LVar7 = local_c8[0];
          }
          if (bVar6 < (byte)local_50._M_dataplus._M_p) {
            bVar6 = (byte)local_50._M_dataplus._M_p;
          }
          if (bVar4 < (byte)(local_c8[0] - (byte)local_50._M_dataplus._M_p)) {
            bVar4 = local_c8[0] - (byte)local_50._M_dataplus._M_p;
          }
        }
        else if (&local_e0 != local_98) {
          local_98->id_ = local_e0.id_;
          local_98->physical_type_ = local_e0.physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(local_68,&local_e0.type_info_);
        }
        if (!bVar2) break;
        __n = __n + 1;
        bVar8 = __n < (ulong)(((long)(local_88._8_8_ - local_88._0_8_) >> 3) * -0x5555555555555555);
      } while (bVar8);
    }
    if (bVar8) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_88);
      bVar8 = true;
      goto LAB_011b8827;
    }
    LogicalType::DECIMAL(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1d);
    result_type = local_98;
    local_e0.physical_type_ = local_c8[1];
    local_e0.id_ = local_c8[0];
    LogicalType::~LogicalType((LogicalType *)local_c8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_88);
  }
LAB_011b87fe:
  bVar8 = true;
  if (&local_e0 != result_type) {
    result_type->id_ = local_e0.id_;
    result_type->physical_type_ = local_e0.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&result_type->type_info_,&local_e0.type_info_);
  }
LAB_011b8827:
  LogicalType::~LogicalType(&local_e0);
  return bVar8;
}

Assistant:

bool BoundComparisonExpression::TryBindComparison(ClientContext &context, const LogicalType &left_type,
                                                  const LogicalType &right_type, LogicalType &result_type,
                                                  ExpressionType comparison_type) {
	LogicalType res;
	bool is_equality;
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
	case ExpressionType::COMPARE_NOTEQUAL:
	case ExpressionType::COMPARE_IN:
	case ExpressionType::COMPARE_NOT_IN:
	case ExpressionType::COMPARE_DISTINCT_FROM:
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		is_equality = true;
		break;
	default:
		is_equality = false;
		break;
	}
	if (is_equality) {
		res = LogicalType::ForceMaxLogicalType(left_type, right_type);
	} else {
		if (!LogicalType::TryGetMaxLogicalType(context, left_type, right_type, res)) {
			return false;
		}
	}
	switch (res.id()) {
	case LogicalTypeId::DECIMAL: {
		// result is a decimal: we need the maximum width and the maximum scale over width
		vector<LogicalType> argument_types = {left_type, right_type};
		uint8_t max_width = 0, max_scale = 0, max_width_over_scale = 0;
		for (idx_t i = 0; i < argument_types.size(); i++) {
			uint8_t width, scale;
			auto can_convert = argument_types[i].GetDecimalProperties(width, scale);
			if (!can_convert) {
				result_type = res;
				return true;
			}
			max_width = MaxValue<uint8_t>(width, max_width);
			max_scale = MaxValue<uint8_t>(scale, max_scale);
			max_width_over_scale = MaxValue<uint8_t>(width - scale, max_width_over_scale);
		}
		max_width = MaxValue<uint8_t>(max_scale + max_width_over_scale, max_width);
		if (max_width > Decimal::MAX_WIDTH_DECIMAL) {
			// target width does not fit in decimal: truncate the scale (if possible) to try and make it fit
			max_width = Decimal::MAX_WIDTH_DECIMAL;
		}
		res = LogicalType::DECIMAL(max_width, max_scale);
		break;
	}
	case LogicalTypeId::VARCHAR:
		// for comparison with strings, we prefer to bind to the numeric types
		if (left_type.id() != LogicalTypeId::VARCHAR && SwitchVarcharComparison(left_type)) {
			res = LogicalType::NormalizeType(left_type);
		} else if (right_type.id() != LogicalTypeId::VARCHAR && SwitchVarcharComparison(right_type)) {
			res = LogicalType::NormalizeType(right_type);
		} else {
			// else: check if collations are compatible
			auto left_collation = StringType::GetCollation(left_type);
			auto right_collation = StringType::GetCollation(right_type);
			if (!left_collation.empty() && !right_collation.empty() && left_collation != right_collation) {
				throw BinderException("Cannot combine types with different collation!");
			}
		}
		break;
	default:
		break;
	}
	result_type = res;
	return true;
}